

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.hpp
# Opt level: O1

int qpixl::writePGMA<std::vector<double,std::allocator<double>>>
              (string *fileName,vector<double,_std::allocator<double>_> *data,size_t nrows,
              size_t ncols,size_t maxval,int zeroPad)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  double dVar11;
  ofstream ostrm;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)fileName,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR -- failed to open ",0x18);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    iVar6 = -1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P2",2);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# Generated by QPIXL++",0x16);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    sVar10 = nrows;
    if ((zeroPad & 0xfffffffdU) != 0) {
      if (zeroPad != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ERROR -- zeroPad : ",0x13);
        plVar3 = (long *)std::ostream::operator<<(&std::cerr,zeroPad);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        iVar6 = -3;
        std::ostream::flush();
        goto LAB_001095e1;
      }
      uVar4 = nrows - 1 >> 1 | nrows - 1;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      uVar4 = uVar4 >> 0x10 | uVar4;
      sVar10 = (uVar4 >> 0x20 | uVar4) + 1;
    }
    if (nrows != 0) {
      lVar5 = 0;
      sVar8 = 0;
      do {
        sVar7 = ncols;
        lVar9 = lVar5;
        if (ncols != 0) {
          do {
            dVar11 = ceil(*(double *)
                           ((long)(data->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar9));
            iVar6 = (int)dVar11;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            if ((int)maxval <= iVar6) {
              iVar6 = (int)maxval;
            }
            poVar2 = (ostream *)std::ostream::operator<<(&local_230,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            lVar9 = lVar9 + sVar10 * 8;
            sVar7 = sVar7 - 1;
          } while (sVar7 != 0);
        }
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
        std::ostream::put((char)&local_230);
        std::ostream::flush();
        sVar8 = sVar8 + 1;
        lVar5 = lVar5 + 8;
      } while (sVar8 != nrows);
    }
    iVar6 = 0;
    std::ofstream::close();
  }
LAB_001095e1:
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar6;
}

Assistant:

int writePGMA( const std::string fileName, V& data , const size_t nrows , 
                 const size_t ncols , const size_t maxval , 
                 const int zeroPad = 0 ) {
    using T = typename V::value_type ; 
    std::ofstream ostrm( fileName , std::ios::out ) ;

    if ( !ostrm.is_open( ) ) {
      std::cerr << "ERROR -- failed to open " << fileName << std::endl ;
      return -1 ;
    } else {

      // Write header
      ostrm << "P2" << std::endl ;
      ostrm << "# Generated by QPIXL++" << std::endl ;
      ostrm << ncols << " " << nrows << std::endl ;
      ostrm << maxval << std::endl ;

      // Write data
      size_t ldm = 0 ;
      if ( zeroPad == 0 || zeroPad == 2 ) {
        ldm = nrows ;
      } else if ( zeroPad == 1 ) ldm = qpixl::nextpow2( nrows ) ;
      else {
        std::cerr << "ERROR -- zeroPad : " << zeroPad << std::endl ;
          return -3 ;
      }

      for ( int row = 0; row < nrows; ++row ) {
          for ( int col = 0; col < ncols; ++col ) {
            ostrm << std::min( std::max( 
                     int( ceil( data[row + col * ldm] ) ), 0 ), int(maxval) ) 
                  << " " ;    
          }
          ostrm << std::endl ;
      }
    }

    // Close file
    ostrm.close() ;

    return 0 ;
  }